

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_get_role.cc
# Opt level: O2

int __thiscall
aliyun::Ram::GetRole
          (Ram *this,RamGetRoleRequestType *req,RamGetRoleResponseType *response,
          RamErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  Value *pVVar4;
  char *pcVar5;
  allocator<char> local_31c;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319;
  string local_318;
  Value val;
  string str_response;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if (this->use_tls_ != false) {
    pcVar5 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar5,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_31c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar5,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"GetRole",&local_31c);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->role_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"RoleName",(allocator<char> *)&local_318);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"RegionId",(allocator<char> *)&local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,this->region_id_,&local_31c);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RamErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,anon_var_dwarf_1e8fc1 + 9,&local_31c);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,anon_var_dwarf_1e8fc1 + 9,&local_319);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,anon_var_dwarf_1e8fc1 + 9,&local_31a);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,anon_var_dwarf_1e8fc1 + 9,&local_31b);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
      }
      if (response != (RamGetRoleResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Role");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Role");
          bVar1 = Json::Value::isMember(pVVar3,"RoleId");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"RoleId");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=((string *)response,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"RoleName");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"RoleName");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)&(response->role).role_name,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"Arn");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"Arn");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=((string *)&(response->role).arn,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"Description");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"Description");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)&(response->role).description,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"AssumeRolePolicyDocument");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"AssumeRolePolicyDocument");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)&(response->role).assume_role_policy_document,(string *)&local_318)
            ;
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"CreateDate");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](pVVar3,"CreateDate");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar4);
            std::__cxx11::string::operator=
                      ((string *)&(response->role).create_date,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          bVar1 = Json::Value::isMember(pVVar3,"UpdateDate");
          if (bVar1) {
            pVVar3 = Json::Value::operator[](pVVar3,"UpdateDate");
            Json::Value::asString_abi_cxx11_(&local_318,pVVar3);
            std::__cxx11::string::operator=
                      ((string *)&(response->role).update_date,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
        }
      }
      goto LAB_001421f2;
    }
  }
  iVar2 = -1;
  if (error_info != (RamErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001421f2:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ram::GetRole(const RamGetRoleRequestType& req,
                      RamGetRoleResponseType* response,
                       RamErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","GetRole");
  if(!req.role_name.empty()) {
    req_rpc->AddRequestQuery("RoleName", req.role_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}